

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

msecnode_t * P_GetSecnode(void)

{
  msecnode_t *pmVar1;
  
  pmVar1 = headsecnode;
  if (headsecnode != (msecnode_t *)0x0) {
    headsecnode = headsecnode->m_snext;
    return pmVar1;
  }
  pmVar1 = (msecnode_t *)
           M_Malloc_Dbg(0x38,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x190b);
  return pmVar1;
}

Assistant:

msecnode_t *P_GetSecnode()
{
	msecnode_t *node;

	if (headsecnode)
	{
		node = headsecnode;
		headsecnode = headsecnode->m_snext;
	}
	else
	{
		node = (msecnode_t *)M_Malloc(sizeof(*node));
	}
	return node;
}